

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  ZSTD_buffered_policy_e zbuff;
  ZSTD_strategy ZVar1;
  U32 UVar2;
  void *pvVar3;
  ZSTD_freeFunction p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  undefined4 uVar10;
  U32 UVar11;
  size_t sVar12;
  size_t __n;
  ZSTD_matchState_t *dstMatchState;
  ulong pledgedSrcSize_00;
  ZSTD_matchState_t *srcMatchState;
  size_t local_e8;
  ZSTD_CCtx_params local_e0;
  
  sVar12 = 0xffffffffffffffc4;
  if (srcCCtx->stage == ZSTDcs_init) {
    local_e8 = 0;
    pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    zbuff = srcCCtx->bufferedPolicy;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var4 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var4;
    memcpy(&local_e0,&dstCCtx->requestedParams,0xb0);
    local_e0.cParams.windowLog = (srcCCtx->appliedParams).cParams.windowLog;
    local_e0.cParams.chainLog = (srcCCtx->appliedParams).cParams.chainLog;
    uVar5 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar6 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar7 = (srcCCtx->appliedParams).cParams.minMatch;
    local_e0.cParams.targetLength = (srcCCtx->appliedParams).cParams.targetLength;
    local_e0.cParams.strategy = (srcCCtx->appliedParams).cParams.strategy;
    local_e0.useRowMatchFinder = (srcCCtx->appliedParams).useRowMatchFinder;
    local_e0.fParams.noDictIDFlag = 0;
    local_e0.cParams.hashLog = uVar5;
    local_e0.cParams.searchLog = uVar6;
    local_e0.cParams.minMatch = uVar7;
    local_e0.fParams._0_8_ = (ulong)(pledgedSrcSize_00 != 0xffffffffffffffff);
    ZSTD_resetCCtx_internal(dstCCtx,&local_e0,pledgedSrcSize_00,0,ZSTDcrp_leaveDirty,zbuff);
    (dstCCtx->workspace).tableValidEnd = (dstCCtx->workspace).objectEnd;
    ZVar1 = (srcCCtx->appliedParams).cParams.strategy;
    if (ZVar1 != ZSTD_fast) {
      if ((ZVar1 - ZSTD_greedy < 3) &&
         ((srcCCtx->appliedParams).useRowMatchFinder == ZSTD_urm_enableRowMatchFinder)) {
        local_e8 = 0;
      }
      else {
        local_e8 = 4L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
      }
    }
    UVar2 = (srcCCtx->blockState).matchState.hashLog3;
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           4L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f));
    memcpy((dstCCtx->blockState).matchState.chainTable,(srcCCtx->blockState).matchState.chainTable,
           local_e8);
    __n = 0;
    if (UVar2 != 0) {
      __n = 4L << ((byte)UVar2 & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable3,(srcCCtx->blockState).matchState.hashTable3,
           __n);
    pvVar3 = (dstCCtx->workspace).tableEnd;
    if ((dstCCtx->workspace).tableValidEnd < pvVar3) {
      (dstCCtx->workspace).tableValidEnd = pvVar3;
    }
    uVar10 = *(undefined4 *)&(srcCCtx->blockState).matchState.window.field_0x24;
    (dstCCtx->blockState).matchState.window.nbOverflowCorrections =
         (srcCCtx->blockState).matchState.window.nbOverflowCorrections;
    *(undefined4 *)&(dstCCtx->blockState).matchState.window.field_0x24 = uVar10;
    pBVar8 = (srcCCtx->blockState).matchState.window.nextSrc;
    pBVar9 = (srcCCtx->blockState).matchState.window.base;
    UVar2 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar11 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.dictBase =
         (srcCCtx->blockState).matchState.window.dictBase;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar2;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar11;
    (dstCCtx->blockState).matchState.window.nextSrc = pBVar8;
    (dstCCtx->blockState).matchState.window.base = pBVar9;
    UVar2 = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    (dstCCtx->blockState).matchState.nextToUpdate = UVar2;
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x11f0);
    sVar12 = 0;
  }
  return sVar12;
}

Assistant:

size_t ZSTD_copyCCtx(ZSTD_CCtx* dstCCtx, const ZSTD_CCtx* srcCCtx, unsigned long long pledgedSrcSize)
{
    ZSTD_frameParameters fParams = { 1 /*content*/, 0 /*checksum*/, 0 /*noDictID*/ };
    ZSTD_buffered_policy_e const zbuff = srcCCtx->bufferedPolicy;
    ZSTD_STATIC_ASSERT((U32)ZSTDb_buffered==1);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    fParams.contentSizeFlag = (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN);

    return ZSTD_copyCCtx_internal(dstCCtx, srcCCtx,
                                fParams, pledgedSrcSize,
                                zbuff);
}